

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O0

bool __thiscall
cppcms::impl::file_server::check_in_document_root(file_server *this,string *normal,string *real)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  reference pvVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string *unaff_retaddr;
  size_t real_size;
  string *ref;
  uint i;
  string root;
  string *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a8 [36];
  undefined4 local_84;
  string local_80 [16];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  file_server *in_stack_ffffffffffffffa8;
  uint local_44;
  string local_40 [32];
  string *local_20;
  byte local_1;
  
  __lhs = in_RSI;
  local_20 = in_RDX;
  normalize_path(unaff_retaddr);
  std::__cxx11::string::string(local_40,(string *)(in_RDI + 0x30));
  local_44 = 0;
  while( true ) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_44;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RDI + 0x50));
    if (pbVar2 <= __rhs) break;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RDI + 0x50),(ulong)local_44);
    in_stack_ffffffffffffff2f =
         is_file_prefix((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                        in_stack_ffffffffffffff20);
    if ((bool)in_stack_ffffffffffffff2f) {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(in_RDI + 0x50),(ulong)local_44);
      std::__cxx11::string::operator=(local_40,(string *)&pvVar3->second);
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_80,(ulong)in_RSI);
      std::__cxx11::string::operator=((string *)in_RSI,local_80);
      std::__cxx11::string::~string(local_80);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::operator=((string *)in_RSI,"/");
      }
      break;
    }
    local_44 = local_44 + 1;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar5 == '/') {
      if ((*(byte *)(in_RDI + 0x99) & 1) == 0) {
        std::operator+(__lhs,__rhs);
        std::__cxx11::string::operator=(local_20,local_a8);
        std::__cxx11::string::~string(local_a8);
        lVar6 = std::__cxx11::string::size();
        if (lVar6 != 0) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
          bVar1 = is_directory_separator(*pcVar5);
          if (bVar1) {
            std::__cxx11::string::resize((ulong)local_20);
          }
        }
      }
      else {
        bVar1 = is_in_root(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_003dee3c;
        }
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_003dee3c:
  local_84 = 1;
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool file_server::check_in_document_root(std::string normal,std::string &real) 
{
	normalize_path(normal);
	std::string root = document_root_;
	for(unsigned i=0;i<alias_.size();i++) {
		std::string const &ref=alias_[i].first;
		if(is_file_prefix(ref,normal))
		{
			root = alias_[i].second;
			normal = normal.substr(ref.size());
			if(normal.empty())
				normal="/";
			break;
		}
	}
	if(normal.empty())
		return false;
	if(normal[0]!='/')
		return false;
	if(check_symlinks_) {
		if(!is_in_root(normal,root,real))
			return false;
	}
	else {
		real = root + normal;
        // remove trailing '/' from file name
        size_t real_size = real.size();
        if(real_size > 0 && is_directory_separator(real[real_size-1])) {
            real.resize(real_size-1);
        }
	}
	return true;
}